

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O3

void __thiscall
llm_build_wavtokenizer_dec::llm_build_wavtokenizer_dec
          (llm_build_wavtokenizer_dec *this,llama_model *model,llm_graph_params *params,
          ggml_cgraph *gf)

{
  undefined8 *puVar1;
  ggml_context *pgVar2;
  pointer plVar3;
  ggml_tensor *pgVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ggml_tensor *local_58;
  
  llm_graph_context::llm_graph_context(&this->super_llm_graph_context,params);
  pgVar4 = llm_graph_context::build_inp_embd(&this->super_llm_graph_context,model->tok_embd);
  pgVar2 = (this->super_llm_graph_context).ctx0;
  uVar5 = ggml_transpose(pgVar2,pgVar4);
  uVar5 = ggml_cont(pgVar2,uVar5);
  uVar5 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,model->conv1d,uVar5,1);
  local_58 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,uVar5,model->conv1d_b);
  if ((((this->super_llm_graph_context).hparams)->posnet).n_layer != 0) {
    lVar10 = 0x4a0;
    uVar9 = 0;
    do {
      uVar8 = (uint)uVar9;
      if (5 < uVar8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
                   ,0x3061,"unknown posnet layer");
      }
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      if ((0x1bU >> (uVar8 & 0x1f) & 1) == 0) {
        if (uVar8 == 2) {
          pgVar4 = llm_graph_context::build_norm
                             (&this->super_llm_graph_context,local_58,
                              *(ggml_tensor **)((long)plVar3 + lVar10 + -0x58),
                              *(ggml_tensor **)((long)plVar3 + lVar10 + -0x50),LLM_NORM_GROUP,0);
          uVar5 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                  *(undefined8 *)((long)plVar3 + lVar10 + -0x48),pgVar4,1,1);
          uVar7 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                  *(undefined8 *)((long)plVar3 + lVar10 + -0x38),pgVar4,1,1);
          uVar6 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                  *(undefined8 *)((long)plVar3 + lVar10 + -0x28),pgVar4,1,1);
          uVar5 = ggml_add((this->super_llm_graph_context).ctx0,uVar5,
                           *(undefined8 *)((long)plVar3 + lVar10 + -0x40));
          uVar7 = ggml_add((this->super_llm_graph_context).ctx0,uVar7,
                           *(undefined8 *)((long)plVar3 + lVar10 + -0x30));
          uVar6 = ggml_add((this->super_llm_graph_context).ctx0,uVar6,
                           *(undefined8 *)((long)plVar3 + lVar10 + -0x20));
          pgVar2 = (this->super_llm_graph_context).ctx0;
          uVar5 = ggml_transpose(pgVar2,uVar5);
          uVar5 = ggml_cont(pgVar2,uVar5);
          pgVar2 = (this->super_llm_graph_context).ctx0;
          uVar7 = ggml_transpose(pgVar2,uVar7);
          uVar7 = ggml_cont(pgVar2,uVar7);
          uVar5 = ggml_mul_mat((this->super_llm_graph_context).ctx0,uVar7,uVar5);
          uVar5 = ggml_soft_max_ext(1.0 / SQRT((float)(((this->super_llm_graph_context).hparams)->
                                                      posnet).n_embd),
                                    (this->super_llm_graph_context).ctx0,uVar5,0);
          uVar5 = ggml_mul_mat((this->super_llm_graph_context).ctx0,uVar5,uVar6);
          uVar5 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                  *(undefined8 *)((long)plVar3 + lVar10 + -0x18),uVar5,1);
          uVar5 = ggml_add((this->super_llm_graph_context).ctx0,uVar5,
                           *(undefined8 *)((long)plVar3 + lVar10 + -0x10));
          local_58 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,uVar5,local_58);
        }
        else {
          local_58 = llm_graph_context::build_norm
                               (&this->super_llm_graph_context,local_58,
                                *(ggml_tensor **)((long)plVar3 + lVar10 + -8),
                                *(ggml_tensor **)((long)&plVar3->attn_norm + lVar10),LLM_NORM_GROUP,
                                0);
        }
      }
      else {
        pgVar4 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,local_58,
                            *(ggml_tensor **)((long)plVar3 + lVar10 + -0x98),
                            *(ggml_tensor **)((long)plVar3 + lVar10 + -0x90),LLM_NORM_GROUP,0);
        pgVar2 = (this->super_llm_graph_context).ctx0;
        uVar5 = ggml_sigmoid(pgVar2,pgVar4);
        uVar5 = ggml_mul(pgVar2,uVar5,pgVar4);
        uVar5 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                *(undefined8 *)((long)plVar3 + lVar10 + -0x88),uVar5,1,1);
        pgVar4 = (ggml_tensor *)
                 ggml_add((this->super_llm_graph_context).ctx0,uVar5,
                          *(undefined8 *)((long)plVar3 + lVar10 + -0x80));
        pgVar4 = llm_graph_context::build_norm
                           (&this->super_llm_graph_context,pgVar4,
                            *(ggml_tensor **)((long)plVar3 + lVar10 + -0x78),
                            *(ggml_tensor **)((long)plVar3 + lVar10 + -0x70),LLM_NORM_GROUP,0);
        pgVar2 = (this->super_llm_graph_context).ctx0;
        uVar5 = ggml_sigmoid(pgVar2,pgVar4);
        uVar5 = ggml_mul(pgVar2,uVar5,pgVar4);
        uVar5 = ggml_conv_1d_ph((this->super_llm_graph_context).ctx0,
                                *(undefined8 *)((long)plVar3 + lVar10 + -0x68),uVar5,1);
        uVar5 = ggml_add((this->super_llm_graph_context).ctx0,uVar5,
                         *(undefined8 *)((long)plVar3 + lVar10 + -0x60));
        local_58 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,uVar5,local_58);
      }
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x4f0;
    } while (uVar9 < (((this->super_llm_graph_context).hparams)->posnet).n_layer);
  }
  pgVar2 = (this->super_llm_graph_context).ctx0;
  uVar5 = ggml_transpose(pgVar2,local_58);
  pgVar4 = (ggml_tensor *)ggml_cont(pgVar2,uVar5);
  pgVar4 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,pgVar4,model->tok_norm,model->tok_norm_b,
                      LLM_NORM,-1);
  pgVar2 = (this->super_llm_graph_context).ctx0;
  uVar5 = ggml_transpose(pgVar2,pgVar4);
  uVar5 = ggml_cont(pgVar2,uVar5);
  if ((((this->super_llm_graph_context).hparams)->convnext).n_layer != 0) {
    lVar10 = 0x4e8;
    uVar9 = 0;
    do {
      plVar3 = (model->layers).super__Vector_base<llama_layer,_std::allocator<llama_layer>_>._M_impl
               .super__Vector_impl_data._M_start;
      uVar7 = ggml_conv_1d_dw_ph((this->super_llm_graph_context).ctx0,
                                 *(undefined8 *)((long)plVar3 + lVar10 + -0x40),uVar5,1);
      uVar7 = ggml_add((this->super_llm_graph_context).ctx0,uVar7,
                       *(undefined8 *)((long)plVar3 + lVar10 + -0x38));
      pgVar2 = (this->super_llm_graph_context).ctx0;
      uVar7 = ggml_transpose(pgVar2,uVar7);
      pgVar4 = (ggml_tensor *)ggml_cont(pgVar2,uVar7);
      pgVar4 = llm_graph_context::build_norm
                         (&this->super_llm_graph_context,pgVar4,
                          *(ggml_tensor **)((long)plVar3 + lVar10 + -0x30),
                          *(ggml_tensor **)((long)plVar3 + lVar10 + -0x28),LLM_NORM,-1);
      puVar1 = (undefined8 *)((long)plVar3 + lVar10 + -0x10);
      pgVar4 = llm_graph_context::build_ffn
                         (&this->super_llm_graph_context,pgVar4,
                          *(ggml_tensor **)((long)plVar3 + lVar10 + -0x20),
                          *(ggml_tensor **)((long)plVar3 + lVar10 + -0x18),(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,(ggml_tensor *)0x0,(ggml_tensor *)0x0,
                          (ggml_tensor *)*puVar1,(ggml_tensor *)puVar1[1],(ggml_tensor *)0x0,
                          (ggml_tensor *)0x0,LLM_FFN_GELU,LLM_FFN_SEQ,(int)uVar9);
      uVar7 = ggml_mul((this->super_llm_graph_context).ctx0,pgVar4,
                       *(undefined8 *)((long)&plVar3->attn_norm + lVar10));
      pgVar2 = (this->super_llm_graph_context).ctx0;
      uVar7 = ggml_transpose(pgVar2,uVar7);
      uVar7 = ggml_cont(pgVar2,uVar7);
      uVar5 = ggml_add((this->super_llm_graph_context).ctx0,uVar7,uVar5);
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x4f0;
    } while (uVar9 < (((this->super_llm_graph_context).hparams)->convnext).n_layer);
  }
  pgVar2 = (this->super_llm_graph_context).ctx0;
  uVar5 = ggml_transpose(pgVar2,uVar5);
  pgVar4 = (ggml_tensor *)ggml_cont(pgVar2,uVar5);
  pgVar4 = llm_graph_context::build_norm
                     (&this->super_llm_graph_context,pgVar4,model->output_norm,model->output_norm_b,
                      LLM_NORM,-1);
  pgVar4 = llm_graph_context::build_lora_mm(&this->super_llm_graph_context,model->output,pgVar4);
  pgVar4 = (ggml_tensor *)ggml_add((this->super_llm_graph_context).ctx0,pgVar4,model->output_b);
  llm_graph_context::cb(&this->super_llm_graph_context,pgVar4,"result_embd",-1);
  ((this->super_llm_graph_context).res._M_t.
   super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
   super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
   super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl)->t_embd = pgVar4;
  ggml_build_forward_expand(gf,pgVar4);
  return;
}

Assistant:

llm_build_wavtokenizer_dec(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, inpL));

        cur = ggml_conv_1d_ph(ctx0, model.conv1d, cur, 1, 1);
        cur = ggml_add(ctx0, cur, model.conv1d_b);

        // posnet
        for (uint32_t il = 0; il < hparams.posnet.n_layer; ++il) {
            const auto & layer = model.layers[il].posnet;

            inpL = cur;

            switch (il) {
                case 0:
                case 1:
                case 3:
                case 4:
                    {
                        cur = build_norm(cur,
                                layer.norm1,
                                layer.norm1_b,
                                LLM_NORM_GROUP, 0);

                        cur = ggml_mul(ctx0, ggml_sigmoid(ctx0, cur), cur);

                        cur = ggml_conv_1d_ph(ctx0, layer.conv1, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.conv1_b);

                        cur = build_norm(cur,
                                layer.norm2,
                                layer.norm2_b,
                                LLM_NORM_GROUP, 0);

                        cur = ggml_mul(ctx0, ggml_sigmoid(ctx0, cur), cur);

                        cur = ggml_conv_1d_ph(ctx0, layer.conv2, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.conv2_b);

                        cur = ggml_add(ctx0, cur, inpL);
                    } break;
                case 2:
                    {
                        cur = build_norm(cur,
                                layer.attn_norm,
                                layer.attn_norm_b,
                                LLM_NORM_GROUP, 0);

                        ggml_tensor * q;
                        ggml_tensor * k;
                        ggml_tensor * v;

                        q = ggml_conv_1d_ph(ctx0, layer.attn_q, cur, 1, 1);
                        k = ggml_conv_1d_ph(ctx0, layer.attn_k, cur, 1, 1);
                        v = ggml_conv_1d_ph(ctx0, layer.attn_v, cur, 1, 1);

                        q = ggml_add(ctx0, q, layer.attn_q_b);
                        k = ggml_add(ctx0, k, layer.attn_k_b);
                        v = ggml_add(ctx0, v, layer.attn_v_b);

                        q = ggml_cont(ctx0, ggml_transpose(ctx0, q));
                        k = ggml_cont(ctx0, ggml_transpose(ctx0, k));

                        ggml_tensor * kq = ggml_mul_mat(ctx0, k, q);

                        kq = ggml_soft_max_ext(ctx0, kq, nullptr, 1.0f/sqrtf(float(hparams.posnet.n_embd)), 0.0f);

                        cur = ggml_mul_mat(ctx0, kq, v);

                        cur = ggml_conv_1d_ph(ctx0, layer.attn_o, cur, 1, 1);
                        cur = ggml_add(ctx0, cur, layer.attn_o_b);

                        cur = ggml_add(ctx0, cur, inpL);
                    } break;
                case 5:
                    {
                        cur = build_norm(cur,
                                layer.norm,
                                layer.norm_b,
                                LLM_NORM_GROUP, 0);
                    } break;
                default: GGML_ABORT("unknown posnet layer");
            };
        }

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        cur = build_norm(cur,
                model.tok_norm,
                model.tok_norm_b,
                LLM_NORM, -1);

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        inpL = cur;

        // convnext
        for (uint32_t il = 0; il < hparams.convnext.n_layer; ++il) {
            const auto & layer = model.layers[il].convnext;

            cur = inpL;

            cur = ggml_conv_1d_dw_ph(ctx0, layer.dw, cur, 1, 1);
            cur = ggml_add(ctx0, cur, layer.dw_b);

            cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

            cur = build_norm(cur,
                    layer.norm,
                    layer.norm_b,
                    LLM_NORM, -1);

            cur = build_ffn(cur,
                    layer.pw1, layer.pw1_b, NULL,
                    NULL,      NULL,        NULL,
                    layer.pw2, layer.pw2_b, NULL,
                    NULL,
                    LLM_FFN_GELU, LLM_FFN_SEQ, il);

            cur = ggml_mul(ctx0, cur, layer.gamma);

            cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

            inpL = ggml_add(ctx0, cur, inpL);
        }

        cur = inpL;

        cur = ggml_cont(ctx0, ggml_transpose(ctx0, cur));

        cur = build_norm(cur,
                model.output_norm,
                model.output_norm_b,
                LLM_NORM, -1);

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cur = ggml_add(ctx0, cur, model.output_b);

        cb(cur, "result_embd", -1);
        res->t_embd = cur;

        ggml_build_forward_expand(gf, cur);
    }